

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O3

void __thiscall
vkt::
InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::PipelineLayout::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::PipelineLayout::Parameters>::Args,_vkt::NoPrograms1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::PipelineLayout::Parameters>::Args>_>
::initPrograms(InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::PipelineLayout::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::PipelineLayout::Parameters>::Args,_vkt::NoPrograms1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::PipelineLayout::Parameters>::Args>_>
               *this,SourceCollections *dst)

{
  Parameters local_38;
  
  api::anon_unknown_1::PipelineLayout::Parameters::Parameters(&local_38,&(this->m_arg0).arg0);
  if (local_38.pushConstantRanges.
      super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.pushConstantRanges.
                    super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.pushConstantRanges.
                          super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.pushConstantRanges.
                          super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
  ::~vector(&local_38.descriptorSetLayouts);
  return;
}

Assistant:

Args (Function func_, Arg0 arg0_) : func(func_), arg0(arg0_) {}